

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall tinyusdz::XformOp::set_value<tinyusdz::value::quatf>(XformOp *this,quatf *v)

{
  quatf *v_local;
  XformOp *this_local;
  
  primvar::PrimVar::set_value<tinyusdz::value::quatf>(&this->_var,v);
  return;
}

Assistant:

void set_value(const T &v) {
    _var.set_value(v);
  }